

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
dlib::
add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>
::back_propagate_error
          (add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>
           *this,tensor *x,tensor *gradient_input,zero_gradients zero_grads)

{
  add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>
  *this_00;
  tensor *gradient_input_00;
  undefined7 in_register_00000009;
  subnet_wrapper<dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
  wsub;
  subnet_wrapper<dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
  local_68;
  
  local_68.l = (this->subnetwork)._M_t.
               super___uniq_ptr_impl<dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>_*,_std::default_delete<dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>_>_>
               .
               super__Head_base<0UL,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>_*,_false>
               ._M_head_impl;
  local_68.subnetwork.l =
       *(add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>
         **)&((local_68.l)->subnetwork)._M_t.
             super___uniq_ptr_impl<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>_>_>
  ;
  local_68.subnetwork.subnetwork.l =
       *(add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>
         **)((long)local_68.subnetwork.l + 0xa0);
  local_68.subnetwork.subnetwork.subnetwork.l =
       *(add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
         **)&((local_68.subnetwork.subnetwork.l)->subnetwork)._M_t.
             super___uniq_ptr_impl<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>_>_>
  ;
  local_68.subnetwork.subnetwork.subnetwork.subnetwork.l =
       *(add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void> **)
        ((long)local_68.subnetwork.subnetwork.subnetwork.l + 0x180);
  local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork._sample_expansion_factor =
       (local_68.subnetwork.subnetwork.subnetwork.subnetwork.l)->_sample_expansion_factor;
  local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.l =
       (repeat_input_layer *)local_68.subnetwork.subnetwork.subnetwork.subnetwork.l;
  resizable_tensor::copy_size(&this->params_grad,(tensor *)this);
  bn_<(dlib::layer_mode)0>::
  backward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::con_<256l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<256l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,true,void>>
            (&this->details,gradient_input,&local_68,&(this->params_grad).super_tensor);
  this_00 = (this->subnetwork)._M_t.
            super___uniq_ptr_impl<dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>_*,_std::default_delete<dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>_>_>
            .
            super__Head_base<0UL,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>_*,_false>
            ._M_head_impl;
  gradient_input_00 =
       add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>
       ::private_get_gradient_input(this_00);
  add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>
  ::back_propagate_error(this_00,x,gradient_input_00,zero_grads);
  this->gradient_input_is_stale = (int)CONCAT71(in_register_00000009,zero_grads) == 1;
  return;
}

Assistant:

void back_propagate_error(
            const tensor& x,
            const tensor& gradient_input,
            zero_gradients zero_grads = zero_gradients::yes
        )
        {
            dimpl::subnet_wrapper<subnet_type> wsub(*subnetwork);
            params_grad.copy_size(details.get_layer_params());
            impl::call_layer_backward(details, private_get_output(),
                gradient_input, wsub, static_cast<tensor&>(params_grad));

            subnetwork->back_propagate_error(x, zero_grads); 

            // zero out get_gradient_input()
            gradient_input_is_stale = zero_grads == zero_gradients::yes;
        }